

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O0

type __thiscall
itlib::
flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
::operator[]<char_const(&)[5]>
          (flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
           *this,char (*k) [5])

{
  iterator iVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  reference b;
  pointer ppVar4;
  void *extraout_RDX;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  *__rhs;
  byte local_75;
  Variant local_68;
  const_iterator local_40;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  *local_38;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_30;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_28;
  iterator i;
  char (*k_local) [5];
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  *this_local;
  
  i._M_current = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
                  *)k;
  local_28._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
        *)flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::lower_bound<char[5]>
                    ((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                      *)this,k);
  local_30._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
        *)flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
          ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                 *)this);
  __rhs = &local_30;
  bVar2 = __gnu_cxx::operator!=(&local_28,__rhs);
  local_75 = 0;
  if (bVar2) {
    iVar3 = flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
            ::cmp((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                   *)this,__rhs,extraout_RDX);
    iVar1 = i;
    b = __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
        ::operator*(&local_28);
    bVar2 = fmimpl::pair_compare<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less>::operator()
                      ((void *)CONCAT44(extraout_var,iVar3),(char (*) [5])iVar1._M_current,b);
    local_75 = bVar2 ^ 0xff;
  }
  if ((local_75 & 1) == 0) {
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::string,Rml::Variant>const*,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
    ::__normal_iterator<std::pair<std::__cxx11::string,Rml::Variant>*>
              ((__normal_iterator<std::pair<std::__cxx11::string,Rml::Variant>const*,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                *)&local_40,&local_28);
    iVar1 = i;
    Rml::Variant::Variant(&local_68);
    local_38 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
                *)std::
                  vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>
                  ::emplace<char_const(&)[5],Rml::Variant>
                            ((vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>
                              *)this,local_40,iVar1._M_current,&local_68);
    local_28._M_current = local_38;
    Rml::Variant::~Variant(&local_68);
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
             ::operator->(&local_28);
  }
  else {
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
             ::operator->(&local_28);
  }
  this_local = (flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                *)&ppVar4->second;
  return (type)this_local;
}

Assistant:

typename std::enable_if<std::is_constructible<key_type, K>::value,
    mapped_type&>::type operator[](K&& k)
    {
        auto i = lower_bound(k);
        if (i != end() && !cmp()(k, *i))
        {
            return i->second;
        }

        i = m_container.emplace(i, std::forward<K>(k), mapped_type());
        return i->second;
    }